

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAWInteractionType.hpp
# Opt level: O2

void __thiscall
OpenMD::MAWInteractionType::MAWInteractionType
          (MAWInteractionType *this,RealType myD0,RealType myBeta0,RealType myR0,RealType myCa1,
          RealType myCb1)

{
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__NonBondedInteractionType_002bde28;
  this->D_e = myD0;
  this->beta = myBeta0;
  this->r_e = myR0;
  this->ca1 = myCa1;
  this->cb1 = myCb1;
  NonBondedInteractionType::setMAW(&this->super_NonBondedInteractionType);
  return;
}

Assistant:

MAWInteractionType(RealType myD0, RealType myBeta0, RealType myR0,
                       RealType myCa1, RealType myCb1) {
      D_e  = myD0;
      beta = myBeta0;
      r_e  = myR0;
      ca1  = myCa1;
      cb1  = myCb1;
      setMAW();
    }